

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O1

int stlss_(double *y,int *n,int *np,int *ns,int *isdeg,int *nsjump,int *userw,double *rw,
          double *season,double *work1,double *work2,double *work3,double *work4)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int local_54;
  int local_50;
  int c__1;
  int nleft;
  int nright;
  double xs;
  int local_38;
  int local_34;
  int k;
  int ok;
  
  local_54 = 1;
  uVar1 = *np;
  if (0 < (int)uVar1) {
    lVar5 = 1;
    do {
      iVar2 = *np;
      uVar7 = (long)(*n - (int)lVar5) / (long)iVar2;
      uVar9 = uVar7 & 0xffffffff;
      iVar3 = (int)uVar7;
      xs._4_4_ = iVar3 + 1;
      if (-1 < iVar3) {
        lVar8 = 0;
        pdVar6 = y;
        do {
          work1[lVar8] = *pdVar6;
          pdVar6 = pdVar6 + iVar2;
          lVar8 = lVar8 + 1;
        } while (uVar9 + 1 != lVar8);
      }
      if ((*userw != 0) && (-1 < iVar3)) {
        lVar8 = 0;
        pdVar6 = rw;
        do {
          work3[lVar8] = *pdVar6;
          pdVar6 = pdVar6 + iVar2;
          lVar8 = lVar8 + 1;
        } while (uVar9 + 1 != lVar8);
      }
      local_38 = xs._4_4_;
      stless_(work1,&local_38,ns,isdeg,nsjump,userw,work3,work2 + 1,work4);
      _nleft = 0.0;
      c__1 = imin(*ns,xs._4_4_);
      stlest_(work1,&local_38,ns,isdeg,(double *)&nleft,work2,&local_54,&c__1,work4,userw,work3,
              &local_34);
      if (local_34 == 0) {
        *work2 = work2[1];
      }
      _nleft = (double)(iVar3 + 2);
      local_50 = imax(1,(iVar3 + 2) - *ns);
      lVar8 = (long)xs._4_4_;
      stlest_(work1,&local_38,ns,isdeg,(double *)&nleft,work2 + lVar8 + 1,&local_50,&local_38,work4,
              userw,work3,&local_34);
      if (local_34 == 0) {
        work2[lVar8 + 1] = work2[lVar8];
      }
      if (-3 < iVar3) {
        uVar4 = iVar3 + 3U;
        if ((int)(iVar3 + 3U) < 2) {
          uVar4 = 1;
        }
        iVar2 = *np;
        uVar7 = 0;
        pdVar6 = season;
        do {
          *pdVar6 = work2[uVar7];
          uVar7 = uVar7 + 1;
          pdVar6 = pdVar6 + iVar2;
        } while (uVar4 != uVar7);
      }
      lVar5 = lVar5 + 1;
      y = y + 1;
      rw = rw + 1;
      season = season + 1;
    } while (lVar5 != (ulong)uVar1 + 1);
  }
  return 0;
}

Assistant:

int stlss_(double *y, int *n, int *np, int *ns, int *isdeg, int *nsjump, int *userw, double *rw, 
	double *season, double *work1, double *work2, double *work3, double *work4)
{
    /* System generated locals */
    int i__1, i__2, i__3;
	int c__1 = 1;

    /* Local variables */
    int i__, j, k, m;
    int ok;
    double xs;
    int nleft, nright;

/* 	called by stlstp() at the beginning of each (inner) iteration */

/* Arg */
/* Var */
    /* Parameter adjustments */
    --work4;
    --work3;
    --work2;
    --work1;
    --rw;
    --y;
    --season;

    /* Function Body */
    if (*np < 1) {
	return 0;
    }
    i__1 = *np;
    for (j = 1; j <= i__1; ++j) {
	k = (*n - j) / *np + 1;
	i__2 = k;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    work1[i__] = y[(i__ - 1) * *np + j];
/* L10: */
	}
	if (*userw) {
	    i__2 = k;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		work3[i__] = rw[(i__ - 1) * *np + j];
/* L12: */
	    }
	}
	stless_(&work1[1], &k, ns, isdeg, nsjump, userw, &work3[1], &work2[2],
		 &work4[1]);
	xs = 0.;
	nright = imin(*ns,k);
	stlest_(&work1[1], &k, ns, isdeg, &xs, &work2[1], &c__1, &nright, &
		work4[1], userw, &work3[1], &ok);
	if (! ok) {
	    work2[1] = work2[2];
	}
	xs = (double) (k + 1);
/* Computing MAX */
	i__2 = 1, i__3 = k - *ns + 1;
	nleft = imax(i__2,i__3);
	stlest_(&work1[1], &k, ns, isdeg, &xs, &work2[k + 2], &nleft, &k, &
		work4[1], userw, &work3[1], &ok);
	if (! ok) {
	    work2[k + 2] = work2[k + 1];
	}
	i__2 = k + 2;
	for (m = 1; m <= i__2; ++m) {
	    season[(m - 1) * *np + j] = work2[m];
/* L18: */
	}
/* L200: */
    }
    return 0;
}